

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate helicsGetFederateByName(char *fedName,HelicsError *err)

{
  char *pcVar1;
  size_t sVar2;
  FedObject *pFVar3;
  HelicsFederate pvVar4;
  string_view newError;
  string_view fedName_00;
  string_view newError_00;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  MasterObjectHolder *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<MasterObjectHolder> mob;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (err == (HelicsError *)0x0) {
    if (fedName != (char *)0x0) {
LAB_0017df48:
      getMasterHolder();
      sVar2 = strlen(fedName);
      fedName_00._M_str = fedName;
      fedName_00._M_len = sVar2;
      pFVar3 = MasterObjectHolder::findFed
                         (mob.super___shared_ptr<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,fedName_00);
      if (pFVar3 == (FedObject *)0x0) {
        if (err != (HelicsError *)0x0) {
          err->error_code = -4;
          getMasterHolder();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,fedName,&local_89);
          std::operator+(&local_88,&local_38," is not an active federate identifier");
          newError_00._M_str = local_88._M_dataplus._M_p;
          newError_00._M_len = local_88._M_string_length;
          pcVar1 = MasterObjectHolder::addErrorString(local_68,newError_00);
          err->message = pcVar1;
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_38);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
        }
        pvVar4 = (HelicsFederate)0x0;
      }
      else {
        std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,
                   &(pFVar3->fedptr).
                    super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
        pvVar4 = generateNewHelicsFederateObject
                           ((shared_ptr<helics::Federate> *)&local_58,pFVar3->type);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mob.super___shared_ptr<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      return pvVar4;
    }
  }
  else if (err->error_code == 0) {
    if (fedName != (char *)0x0) goto LAB_0017df48;
    err->error_code = -4;
    getMasterHolder();
    newError._M_str = "fedName is empty";
    newError._M_len = 0x10;
    pcVar1 = MasterObjectHolder::addErrorString
                       ((MasterObjectHolder *)local_88._M_dataplus._M_p,newError);
    err->message = pcVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  }
  return (HelicsFederate)0x0;
}

Assistant:

HelicsFederate helicsGetFederateByName(const char* fedName, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (fedName == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString("fedName is empty");
        }
        return nullptr;
    }
    auto mob = getMasterHolder();
    auto* fed = mob->findFed(fedName);
    if (fed == nullptr) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(fedName) + " is not an active federate identifier");
        }
        return nullptr;
    }
    return generateNewHelicsFederateObject(fed->fedptr, fed->type);
}